

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O2

void __thiscall TCLAP::CmdLine::xorAdd(CmdLine *this,Arg *a,Arg *b)

{
  vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> ors;
  Arg *local_30;
  _Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30 = a;
  std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>::emplace_back<TCLAP::Arg*>
            ((vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>> *)&local_28,&local_30);
  local_30 = b;
  std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>::emplace_back<TCLAP::Arg*>
            ((vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>> *)&local_28,&local_30);
  (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[5])(this,&local_28);
  std::_Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

inline void CmdLine::xorAdd( Arg& a, Arg& b )
{
	std::vector<Arg*> ors;
	ors.push_back( &a );
	ors.push_back( &b );
	xorAdd( ors );
}